

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

void buzz(int type,int nd,xchar sx,xchar sy,int dx,int dy)

{
  uint uVar1;
  obj *poVar2;
  level *plVar3;
  monst *pmVar4;
  char cVar5;
  char cVar6;
  xchar x;
  xchar y;
  byte bVar7;
  boolean bVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  obj *poVar14;
  int iVar15;
  char *local_108;
  char *local_100;
  char *local_d0;
  int local_c4;
  monst *local_a8;
  int local_90;
  int local_8c;
  bool local_88;
  bool local_87;
  int local_84;
  uchar rmn;
  int bounce;
  obj *m_amulet;
  obj *otmp2;
  int tmp_1;
  boolean mon_could_move;
  int tmp;
  boolean show_breath_glyph;
  boolean is_breath;
  obj *poStack_58;
  int spell_type;
  obj *otmp;
  char *fltxt;
  boolean shopdamage;
  monst *pmStack_40;
  coord save_bhitpos;
  monst *mon;
  xchar lsy;
  xchar lsx;
  rm *loc;
  int local_20;
  int abstype;
  int range;
  int dy_local;
  int dx_local;
  xchar sy_local;
  xchar sx_local;
  int nd_local;
  int type_local;
  
  iVar15 = type;
  if (type < 1) {
    iVar15 = -type;
  }
  iVar15 = iVar15 % 10;
  fltxt._5_1_ = '\0';
  if ((type < 0x14) || (local_87 = true, 0x1d < type)) {
    local_87 = -0x1e < type && type < -0x13;
  }
  local_88 = false;
  if (local_87) {
    iVar9 = type;
    if (type < 1) {
      iVar9 = -type;
    }
    local_88 = iVar9 != 0x18;
  }
  if ((type < 10) || (0x13 < type)) {
    local_8c = 0;
  }
  else {
    local_8c = iVar15 + 0x17e;
  }
  local_90 = iVar15;
  if ((-0x1e < type) && (local_90 = type, type < 1)) {
    local_90 = -type;
  }
  otmp = (obj *)flash_types[local_90];
  if ((u._1052_1_ & 1) != 0) {
    if (type < 0) {
      return;
    }
    iVar15 = zap_hit_mon(u.ustuck,type,nd,&stack0xffffffffffffffa8);
    if (u.ustuck == (monst *)0x0) {
      u._1052_1_ = u._1052_1_ & 0xfe;
    }
    else {
      pcVar11 = The((char *)otmp);
      pcVar12 = mon_nam(u.ustuck);
      pcVar13 = exclam(iVar15);
      pline("%s rips into %s%s",pcVar11,pcVar12,pcVar13);
    }
    if (iVar15 == 1000) {
      (u.ustuck)->mhp = 0;
    }
    if (0 < (u.ustuck)->mhp) {
      return;
    }
    killed(u.ustuck);
    return;
  }
  if (type < 0) {
    newsym((int)u.ux,(int)u.uy);
  }
  local_20 = rn2(7);
  local_20 = local_20 + 7;
  if ((dx == 0) && (dy == 0)) {
    local_20 = 1;
  }
  fltxt._6_2_ = bhitpos;
  iVar9 = zapdir_to_effect(dx,dy,iVar15,local_88);
  tmp_at(-1,iVar9);
  abstype = dy;
  range = dx;
  y = sy;
  x = sx;
LAB_0035201a:
  do {
    dy_local._3_1_ = x;
    dy_local._2_1_ = y;
    plVar3 = level;
    iVar9 = local_20 + -1;
    cVar5 = dy_local._2_1_;
    cVar6 = dy_local._3_1_;
    if (local_20 < 1) {
LAB_00353ae7:
      dy_local._3_1_ = cVar6;
      dy_local._2_1_ = cVar5;
      tmp_at(-6,0);
      if (type == 0xb) {
        iVar9 = dice(0xc,6);
        explode((int)dy_local._3_1_,(int)dy_local._2_1_,0xb,iVar9,'\0',5);
      }
      if (fltxt._5_1_ != '\0') {
        if (iVar15 == 1) {
          local_100 = "burn away";
        }
        else {
          if (iVar15 == 2) {
            local_108 = "shatter";
          }
          else {
            local_108 = "destroy";
            if (iVar15 == 4) {
              local_108 = "disintegrate";
            }
          }
          local_100 = local_108;
        }
        pay_for_damage(local_100,'\0');
      }
      bhitpos = fltxt._6_2_;
      return;
    }
    x = dy_local._3_1_ + (char)range;
    y = dy_local._2_1_ + (char)abstype;
    local_20 = iVar9;
    if ((((x < '\x01') || ('O' < x)) || (y < '\0')) || ('\x14' < y)) break;
    if (level->locations[x][y].typ == '\0') break;
    if ((level->monsters[x][y] == (monst *)0x0) ||
       ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
      local_a8 = (monst *)0x0;
    }
    else {
      local_a8 = level->monsters[x][y];
    }
    pmStack_40 = local_a8;
    if ((viz_array[y][x] & 2U) != 0) {
      if (local_a8 == (monst *)0x0) {
LAB_00352558:
        if ((pmStack_40 == (monst *)0x0) &&
           ((*(uint *)&level->locations[x][y].field_0x6 >> 3 & 1) != 0)) {
          unmap_object((int)x,(int)y);
          newsym((int)x,(int)y);
        }
      }
      else {
        if (local_a8->wormno == '\0') {
          if ((viz_array[local_a8->my][local_a8->mx] & 2U) != 0) goto LAB_003522f7;
          if ((((((u.uprops[0x1e].intrinsic == 0) &&
                 ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
              ((u.uprops[0x40].intrinsic != 0 ||
               ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
             ((local_a8->data->mflags3 & 0x200) != 0)) {
            bVar7 = viz_array[local_a8->my][local_a8->mx] & 1;
            goto joined_r0x003522f1;
          }
        }
        else {
          bVar7 = worm_known(level,local_a8);
joined_r0x003522f1:
          if (bVar7 != 0) {
LAB_003522f7:
            if ((((((*(uint *)&pmStack_40->field_0x60 >> 1 & 1) == 0) ||
                  (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) ||
                (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
               ((((*(uint *)&pmStack_40->field_0x60 >> 7 & 1) == 0 &&
                 ((*(uint *)&pmStack_40->field_0x60 >> 9 & 1) == 0)) &&
                (((byte)u._1052_1_ >> 5 & 1) == 0)))) goto LAB_00352558;
          }
        }
        if (((((pmStack_40->data->mflags1 & 0x10000) == 0) &&
             ((poVar14 = which_armor(pmStack_40,4), poVar14 == (obj *)0x0 ||
              (poVar14 = which_armor(pmStack_40,4), poVar14->otyp != 0x4f)))) &&
            (((((u.uprops[0x1e].intrinsic != 0 ||
                (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                 (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
               (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
                ((((u.uprops[0x19].intrinsic != 0 ||
                   ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
                  (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)))))) &&
              (u.uprops[0x19].blocked == 0)) ||
             (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
              (iVar10 = dist2((int)pmStack_40->mx,(int)pmStack_40->my,(int)u.ux,(int)u.uy),
              iVar10 < 0x41)))))) ||
           (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
            (bVar8 = match_warn_of_mon(pmStack_40), bVar8 != '\0')))) goto LAB_00352558;
        map_invisible(x,y);
      }
      if (('\x10' < plVar3->locations[x][y].typ) ||
         (((('\0' < dy_local._3_1_ && (dy_local._3_1_ < 'P')) && (-1 < dy_local._2_1_)) &&
          ((dy_local._2_1_ < '\x15' && ((viz_array[dy_local._2_1_][dy_local._3_1_] & 2U) != 0))))))
      {
        tmp_at((int)x,(int)y);
      }
      (*windowprocs.win_delay)();
    }
    bhitpos.y = y;
    bhitpos.x = x;
    if (type != 0xb) {
      local_20 = zap_over_floor(x,y,type,(boolean *)((long)&fltxt + 5));
      local_20 = local_20 + iVar9;
    }
    cVar5 = y;
    cVar6 = x;
    if (pmStack_40 == (monst *)0x0) {
      if (((x != u.ux) || (y != u.uy)) || (local_20 < 0)) goto LAB_003536fe;
      nomul(0,(char *)0x0);
      if ((u.usteed != (monst *)0x0) && (iVar9 = rn2(3), iVar9 == 0)) {
        if (local_87) {
          iVar9 = type;
          if (type < 1) {
            iVar9 = -type;
          }
          if (iVar9 == 0x18) goto LAB_0035346b;
        }
        else {
LAB_0035346b:
          bVar8 = mon_reflects(u.usteed,(char *)0x0);
          if (bVar8 != '\0') goto LAB_003534a1;
        }
        pmStack_40 = u.usteed;
        goto LAB_00352694;
      }
LAB_003534a1:
      iVar9 = zap_hit_check((int)u.uac,0);
      if (iVar9 == 0) {
        pcVar11 = The((char *)otmp);
        pline("%s whizzes by you!",pcVar11);
      }
      else {
        local_20 = local_20 + -2;
        pcVar11 = The((char *)otmp);
        pline("%s hits you!",pcVar11);
        if (local_87) {
          iVar9 = type;
          if (type < 1) {
            iVar9 = -type;
          }
          if (iVar9 == 0x18) goto LAB_003534fb;
        }
        else {
LAB_003534fb:
          if (((u.uprops[0x2a].extrinsic != 0) || (youmonst.data == mons + 0x9d)) ||
             (youmonst.data == mons + 0x94)) {
            if ((((u.uprops[0x1e].intrinsic == 0) &&
                 ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
              ureflects("But %s reflects from your %s!","it");
            }
            else {
              pline("For some reason you are not affected.");
            }
            range = -range;
            abstype = -abstype;
            shieldeff(x,y);
            goto LAB_0035362b;
          }
        }
        zap_hit_u(type,nd,(char *)otmp,x,y);
      }
LAB_0035362b:
      if ((iVar15 == 5) && (bVar8 = resists_blnd(&youmonst), bVar8 == '\0')) {
        pline("You are blinded by the flash!");
        iVar9 = dice(nd,0x32);
        make_blinded((long)iVar9,'\0');
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          pline("Your vision quickly clears.");
        }
      }
      stop_occupation();
      nomul(0,(char *)0x0);
    }
    else {
      if (type == 0xb) goto LAB_00353ae7;
      if (-1 < type) {
        pmStack_40->mstrategy = pmStack_40->mstrategy & 0xcfffffff;
      }
LAB_00352694:
      iVar9 = find_mac(pmStack_40);
      iVar9 = zap_hit_check(iVar9,local_8c);
      if (iVar9 == 0) {
        miss((char *)otmp,pmStack_40);
      }
      else {
        if (local_87) {
          iVar9 = type;
          if (type < 1) {
            iVar9 = -type;
          }
          if (iVar9 == 0x18) goto LAB_003526c9;
LAB_0035277f:
          uVar1 = *(uint *)&pmStack_40->field_0x60;
          iVar9 = zap_hit_mon(pmStack_40,type,nd,&stack0xffffffffffffffa8);
          pmVar4 = pmStack_40;
          poVar14 = otmp;
          if (((pmStack_40->data == mons + 0x144) || (pmStack_40->data == mons + 0x146)) ||
             (pmStack_40->data == mons + 0x145)) {
            iVar10 = type;
            if (type < 1) {
              iVar10 = -type;
            }
            if (iVar10 == 0x18) {
              if (pmStack_40->wormno == '\0') {
                if ((viz_array[pmStack_40->my][pmStack_40->mx] & 2U) != 0) goto LAB_00352960;
                if ((((u.uprops[0x1e].intrinsic == 0) &&
                     (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                      (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                    ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                   (((u.uprops[0x40].intrinsic != 0 ||
                     ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0))))
                    && ((pmStack_40->data->mflags3 & 0x200) != 0)))) {
                  bVar7 = viz_array[pmStack_40->my][pmStack_40->mx] & 1;
                  goto joined_r0x0035295a;
                }
              }
              else {
                bVar7 = worm_known(level,pmStack_40);
joined_r0x0035295a:
                if (bVar7 != 0) {
LAB_00352960:
                  if (((((((*(uint *)&pmStack_40->field_0x60 >> 1 & 1) == 0) ||
                         (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) ||
                       (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
                      (((*(uint *)&pmStack_40->field_0x60 >> 7 & 1) == 0 &&
                       ((*(uint *)&pmStack_40->field_0x60 >> 9 & 1) == 0)))) &&
                     (((byte)u._1052_1_ >> 5 & 1) == 0)) {
                    hit((char *)otmp,'\0',pmStack_40,".");
                    pcVar11 = Monnam(pmStack_40);
                    pline("%s disintegrates.",pcVar11);
                    pcVar11 = Monnam(pmStack_40);
                    pcVar11 = s_suffix(pcVar11);
                    if (((youmonst.data)->mflags1 & 0x1000) == 0) {
                      local_c4 = 2;
                      if (youmonst.data == mons + 0x17b || youmonst.data == mons + 0x1e) {
                        local_c4 = 1;
                      }
                    }
                    else {
                      local_c4 = 0;
                    }
                    if (local_c4 == 1) {
                      local_d0 = body_part(1);
                    }
                    else {
                      pcVar12 = body_part(1);
                      local_d0 = makeplural(pcVar12);
                    }
                    pline("%s body reintegrates before your %s!",pcVar11,local_d0);
                    Monnam(pmStack_40);
                    pline("%s resurrects!");
                  }
                }
              }
              pmStack_40->mhp = pmStack_40->mhpmax;
              goto LAB_00353ae7;
            }
          }
          if ((pmStack_40->data == mons + 0x144) && (iVar15 == 4)) {
            if (pmStack_40->wormno == '\0') {
              if ((viz_array[pmStack_40->my][pmStack_40->mx] & 2U) == 0) {
                if (((((u.uprops[0x1e].intrinsic == 0) &&
                      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                    ((u.uprops[0x40].intrinsic != 0 ||
                     ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0))))
                    )) && ((pmStack_40->data->mflags3 & 0x200) != 0)) {
                  bVar7 = viz_array[pmStack_40->my][pmStack_40->mx] & 1;
                  goto joined_r0x00352cc2;
                }
                goto LAB_00353ae7;
              }
            }
            else {
              bVar7 = worm_known(level,pmStack_40);
joined_r0x00352cc2:
              if (bVar7 == 0) goto LAB_00353ae7;
            }
            if ((((((*(uint *)&pmStack_40->field_0x60 >> 1 & 1) == 0) ||
                  (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) ||
                (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
               ((((*(uint *)&pmStack_40->field_0x60 >> 7 & 1) == 0 &&
                 ((*(uint *)&pmStack_40->field_0x60 >> 9 & 1) == 0)) &&
                (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
              hit((char *)otmp,'\0',pmStack_40,".");
              pcVar11 = Monnam(pmStack_40);
              pcVar12 = "ray";
              if (type == 0x18) {
                pcVar12 = "bolt";
              }
              pline("%s absorbs the deadly %s!",pcVar11,pcVar12);
              pline("It seems even stronger than before.");
            }
            goto LAB_00353ae7;
          }
          if (iVar9 == 1000) {
            poVar14 = mlifesaver(pmStack_40);
            if (pmStack_40->wormno == '\0') {
              if ((viz_array[pmStack_40->my][pmStack_40->mx] & 2U) != 0) goto LAB_00352f2a;
              if ((((u.uprops[0x1e].intrinsic == 0) &&
                   (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                    (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                  ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                 (((u.uprops[0x40].intrinsic != 0 ||
                   ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0))))
                  && ((pmStack_40->data->mflags3 & 0x200) != 0)))) {
                bVar7 = viz_array[pmStack_40->my][pmStack_40->mx] & 1;
                goto joined_r0x00352f24;
              }
            }
            else {
              bVar7 = worm_known(level,pmStack_40);
joined_r0x00352f24:
              if (bVar7 != 0) {
LAB_00352f2a:
                if ((((((*(uint *)&pmStack_40->field_0x60 >> 1 & 1) == 0) ||
                      (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) ||
                    (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
                   ((((*(uint *)&pmStack_40->field_0x60 >> 7 & 1) == 0 &&
                     ((*(uint *)&pmStack_40->field_0x60 >> 9 & 1) == 0)) &&
                    (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
                  if (poVar14 == (obj *)0x0) {
                    pcVar11 = Monnam(pmStack_40);
                    pline("%s is disintegrated!",pcVar11);
                  }
                  else {
                    hit((char *)otmp,'\0',pmStack_40,"!");
                  }
                }
              }
            }
            poVar2 = pmStack_40->minvent;
            while (poStack_58 = poVar2, poStack_58 != (obj *)0x0) {
              poVar2 = poStack_58->nobj;
              if ((poStack_58 == poVar14) ||
                 (((objects[poStack_58->otyp].oc_oprop != '\x04' &&
                   (bVar8 = obj_resists(poStack_58,5,0x32), bVar8 == '\0')) &&
                  (bVar8 = is_quest_artifact(poStack_58), bVar8 == '\0')))) {
                if ((poStack_58->owornmask != 0) && (poStack_58->otyp == 0xf0)) {
                  pmStack_40->misc_worn_check = pmStack_40->misc_worn_check & 0xffefffff;
                }
                update_mon_intrinsics(level,pmStack_40,poStack_58,'\0','\x01');
                obj_extract_self(poStack_58);
                obfree(poStack_58,(obj *)0x0);
              }
            }
            if (type < 0) {
              monkilled(pmStack_40,(char *)0x0,-0xf2);
            }
            else {
              xkilled(pmStack_40,2);
            }
          }
          else {
            if (pmStack_40->mhp < 1) {
              if (type < 0) {
                monkilled(pmStack_40,(char *)otmp,0xf2);
              }
              else {
                killed(pmStack_40);
              }
              goto LAB_003533d7;
            }
            if (poStack_58 == (obj *)0x0) {
              pcVar11 = exclam(iVar9);
              hit((char *)poVar14,'\0',pmVar4,pcVar11);
            }
            else {
              if (pmStack_40->wormno == '\0') {
                if ((viz_array[pmStack_40->my][pmStack_40->mx] & 2U) != 0) goto LAB_003532d7;
                if ((((((u.uprops[0x1e].intrinsic == 0) &&
                       ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                      (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                    ((u.uprops[0x40].intrinsic != 0 ||
                     ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0))))
                    )) && ((pmStack_40->data->mflags3 & 0x200) != 0)) {
                  bVar7 = viz_array[pmStack_40->my][pmStack_40->mx] & 1;
                  goto joined_r0x003532d1;
                }
              }
              else {
                bVar7 = worm_known(level,pmStack_40);
joined_r0x003532d1:
                if (bVar7 != 0) {
LAB_003532d7:
                  if (((((((*(uint *)&pmStack_40->field_0x60 >> 1 & 1) == 0) ||
                         (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) ||
                       (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
                      (((*(uint *)&pmStack_40->field_0x60 >> 7 & 1) == 0 &&
                       ((*(uint *)&pmStack_40->field_0x60 >> 9 & 1) == 0)))) &&
                     (((byte)u._1052_1_ >> 5 & 1) == 0)) {
                    pcVar11 = Monnam(pmStack_40);
                    pcVar11 = s_suffix(pcVar11);
                    pcVar12 = distant_name(poStack_58,xname);
                    pline("%s %s is disintegrated!",pcVar11,pcVar12);
                  }
                }
              }
              m_useup(pmStack_40,poStack_58);
            }
            if (((uVar1 >> 0x12 & 1) != 0) && ((*(uint *)&pmStack_40->field_0x60 >> 0x12 & 1) == 0))
            {
              slept_monst(pmStack_40);
            }
          }
        }
        else {
LAB_003526c9:
          bVar8 = mon_reflects(pmStack_40,(char *)0x0);
          pmVar4 = pmStack_40;
          poVar14 = otmp;
          if (bVar8 == '\0') goto LAB_0035277f;
          if ((viz_array[pmStack_40->my][pmStack_40->mx] & 2U) != 0) {
            pcVar11 = exclam(0);
            hit((char *)poVar14,'\0',pmVar4,pcVar11);
            shieldeff(pmStack_40->mx,pmStack_40->my);
            mon_reflects(pmStack_40,"But it reflects from %s %s!");
          }
          range = -range;
          abstype = -abstype;
        }
LAB_003533d7:
        local_20 = local_20 + -2;
      }
    }
LAB_003536fe:
    if ((plVar3->locations[x][y].typ == '\r') && (iVar15 == 4)) {
      iVar9 = type;
      if (type < 1) {
        iVar9 = -type;
      }
      if (iVar9 == 0x18) goto LAB_00353773;
      plVar3->locations[x][y].typ = '\x0e';
      if ((viz_array[y][x] & 2U) != 0) {
        pline("The tree withers!");
        newsym((int)x,(int)y);
      }
      goto LAB_00353ae7;
    }
LAB_00353773:
  } while (('\x10' < plVar3->locations[x][y].typ) &&
          ((bVar8 = closed_door(level,(int)x,(int)y), bVar8 == '\0' || (local_20 < 0))));
  cVar5 = dy_local._2_1_;
  cVar6 = dy_local._3_1_;
  if (type == 0xb) goto LAB_00353ae7;
  local_84 = 0;
  local_20 = local_20 + -1;
  if (((((local_20 != 0) && ('\0' < dy_local._3_1_)) && (dy_local._3_1_ < 'P')) &&
      ((-1 < dy_local._2_1_ && (dy_local._2_1_ < '\x15')))) &&
     ((viz_array[dy_local._2_1_][dy_local._3_1_] & 2U) != 0)) {
    The((char *)otmp);
    pline("%s bounces!");
  }
  if (((range == 0) || (abstype == 0)) || (iVar9 = rn2(0x14), iVar9 == 0)) {
    range = -range;
    abstype = -abstype;
    goto LAB_0035201a;
  }
  if ((((('\0' < x) && (x < 'P')) && (-1 < dy_local._2_1_)) &&
      (((dy_local._2_1_ < '\x15' && (bVar7 = level->locations[x][dy_local._2_1_].typ, 0x10 < bVar7))
       && (bVar8 = closed_door(level,(int)x,(int)dy_local._2_1_), bVar8 == '\0')))) &&
     ((0x18 < bVar7 ||
      (((0 < x + range && (x + range < 0x50)) &&
       ((-1 < dy_local._2_1_ &&
        ((dy_local._2_1_ < '\x15' && ('\x10' < level->locations[x + range][dy_local._2_1_].typ))))))
      )))) {
    local_84 = 1;
  }
  if (((((('\0' < dy_local._3_1_) && (dy_local._3_1_ < 'P')) && (-1 < y)) &&
       (((y < '\x15' && (bVar7 = level->locations[dy_local._3_1_][y].typ, 0x10 < bVar7)) &&
        (bVar8 = closed_door(level,(int)dy_local._3_1_,(int)y), bVar8 == '\0')))) &&
      ((0x18 < bVar7 ||
       ((('\0' < dy_local._3_1_ && (dy_local._3_1_ < 'P')) &&
        ((-1 < y + abstype &&
         ((y + abstype < 0x15 && ('\x10' < level->locations[dy_local._3_1_][y + abstype].typ))))))))
      )) && ((local_84 == 0 || (iVar9 = rn2(2), iVar9 != 0)))) {
    local_84 = 2;
  }
  if (local_84 == 0) {
    range = -range;
  }
  else if (local_84 != 1) {
    if (local_84 == 2) {
      range = -range;
    }
    goto LAB_00353ac2;
  }
  abstype = -abstype;
LAB_00353ac2:
  iVar9 = zapdir_to_effect(range,abstype,iVar15,local_88);
  tmp_at(-5,iVar9);
  goto LAB_0035201a;
}

Assistant:

void buzz(int type, int nd, xchar sx, xchar sy, int dx, int dy)
{
    int range, abstype = abs(type) % 10;
    struct rm *loc;
    xchar lsx, lsy;
    struct monst *mon;
    coord save_bhitpos;
    boolean shopdamage = FALSE;
    const char *fltxt;
    struct obj *otmp;
    int spell_type;
    boolean is_breath = (type >= 20 && type <= 29) ||
			(type >= -29 && type <= -20);
    /* show breath glyphs for non-reflectable breaths (any but disintegration) */
    boolean show_breath_glyph = is_breath && abs(type) != ZT_BREATH(ZT_DEATH);

    /* if its a Hero Spell then get its SPE_TYPE */
    spell_type = is_hero_spell(type) ? SPE_MAGIC_MISSILE + abstype : 0;

    fltxt = flash_types[(type <= -30) ? abstype : abs(type)];
    if (u.uswallow) {
	int tmp;

	if (type < 0) return;
	tmp = zap_hit_mon(u.ustuck, type, nd, &otmp);
	if (!u.ustuck)	u.uswallow = 0;
	else	pline("%s rips into %s%s",
		      The(fltxt), mon_nam(u.ustuck), exclam(tmp));
	/* Using disintegration from the inside only makes a hole... */
	if (tmp == MAGIC_COOKIE)
	    u.ustuck->mhp = 0;
	if (u.ustuck->mhp < 1)
	    killed(u.ustuck);
	return;
    }
    if (type < 0) newsym(u.ux,u.uy);
    range = rn1(7,7);
    if (dx == 0 && dy == 0) range = 1;
    save_bhitpos = bhitpos;

    tmp_at(DISP_BEAM, zapdir_to_effect(dx, dy, abstype, show_breath_glyph));
    while (range-- > 0) {
	lsx = sx; sx += dx;
	lsy = sy; sy += dy;
	if (isok(sx,sy) && (loc = &level->locations[sx][sy])->typ) {
	    mon = m_at(level, sx, sy);
	    if (cansee(sx,sy)) {
		/* reveal/unreveal invisible monsters before tmp_at() */
		if (mon && !canspotmon(level, mon))
		    map_invisible(sx, sy);
		else if (!mon && level->locations[sx][sy].mem_invis) {
		    unmap_object(sx, sy);
		    newsym(sx, sy);
		}
		if (ZAP_POS(loc->typ) || (isok(lsx,lsy) && cansee(lsx,lsy)))
		    tmp_at(sx,sy);
		win_delay_output(); /* wait a little */
	    }
	} else
	    goto make_bounce;

	/* hit() and miss() need bhitpos to match the target */
	bhitpos.x = sx,  bhitpos.y = sy;
	/* Fireballs only damage when they explode */
	if (type != ZT_SPELL(ZT_FIRE))
	    range += zap_over_floor(sx, sy, type, &shopdamage);

	if (mon) {
	    if (type == ZT_SPELL(ZT_FIRE)) break;
	    if (type >= 0) mon->mstrategy &= ~STRAT_WAITMASK;
buzzmonst:
	    if (zap_hit_check(find_mac(mon), spell_type)) {
		/* breaths (except disintegration) are not blocked by reflection */
		if ((!is_breath || abs(type) == ZT_BREATH(ZT_DEATH)) &&
		    mon_reflects(mon, NULL)) {
		    if (cansee(mon->mx,mon->my)) {
			hit(fltxt, FALSE, mon, exclam(0));
			shieldeff(mon->mx, mon->my);
			mon_reflects(mon, "But it reflects from %s %s!");
		    }
		    dx = -dx;
		    dy = -dy;
		} else {
		    boolean mon_could_move = mon->mcanmove;
		    int tmp = zap_hit_mon(mon, type, nd, &otmp);

		    if (is_rider(mon->data) && abs(type) == ZT_BREATH(ZT_DEATH)) {
			if (canseemon(level, mon)) {
			    hit(fltxt, FALSE, mon, ".");
			    pline("%s disintegrates.", Monnam(mon));
			    pline("%s body reintegrates before your %s!",
				  s_suffix(Monnam(mon)),
				  (eyecount(youmonst.data) == 1) ?
				  	body_part(EYE) : makeplural(body_part(EYE)));
			    pline("%s resurrects!", Monnam(mon));
			}
			mon->mhp = mon->mhpmax;
			break; /* Out of while loop */
		    }
		    if (mon->data == &mons[PM_DEATH] && abstype == ZT_DEATH) {
			if (canseemon(level, mon)) {
			    hit(fltxt, FALSE, mon, ".");
			    pline("%s absorbs the deadly %s!", Monnam(mon),
				  type == ZT_BREATH(ZT_DEATH) ?
					"bolt" : "ray");
			    pline("It seems even stronger than before.");
			}
			break; /* Out of while loop */
		    }

		    if (tmp == MAGIC_COOKIE) { /* disintegration */
			struct obj *otmp2, *m_amulet = mlifesaver(mon);

			if (canseemon(level, mon)) {
			    if (!m_amulet)
				pline("%s is disintegrated!", Monnam(mon));
			    else
				hit(fltxt, FALSE, mon, "!");
			}

/* note: worn amulet of life saving must be preserved in order to operate */
#ifndef oresist_disintegration
#define oresist_disintegration(obj) \
		(objects[obj->otyp].oc_oprop == DISINT_RES || \
		 obj_resists(obj, 5, 50) || is_quest_artifact(obj) || \
		 obj == m_amulet)
#endif

			for (otmp = mon->minvent; otmp; otmp = otmp2) {
			    otmp2 = otmp->nobj;
			    if (otmp == m_amulet || !oresist_disintegration(otmp)) {
				/* update the monsters intrinsics and saddle in
				 * case it is lifesaved. */
				if (otmp->owornmask && otmp->otyp == SADDLE)
				    mon->misc_worn_check &= ~W_SADDLE;
				update_mon_intrinsics(level, mon, otmp, FALSE, TRUE);
				obj_extract_self(otmp);
				obfree(otmp, NULL);
			    }
			}

			if (type < 0)
			    monkilled(mon, NULL, -AD_RBRE);
			else
			    xkilled(mon, 2);
		    } else if (mon->mhp < 1) {
			if (type < 0)
			    monkilled(mon, fltxt, AD_RBRE);
			else
			    killed(mon);
		    } else {
			if (!otmp) {
			    /* normal non-fatal hit */
			    hit(fltxt, FALSE, mon, exclam(tmp));
			} else {
			    /* some armor was destroyed; no damage done */
			    if (canseemon(level, mon))
				pline("%s %s is disintegrated!",
				      s_suffix(Monnam(mon)),
				      distant_name(otmp, xname));
			    m_useup(mon, otmp);
			}
			if (mon_could_move && !mon->mcanmove)	/* ZT_SLEEP */
			    slept_monst(mon);
		    }
		}
		range -= 2;
	    } else {
		miss(fltxt,mon);
	    }
	} else if (sx == u.ux && sy == u.uy && range >= 0) {
	    nomul(0, NULL);
	    /* breaths (except disintegration) are not blocked by reflection */
	    if (u.usteed && !rn2(3) &&
		!((!is_breath || abs(type) == ZT_BREATH(ZT_DEATH)) &&
		  mon_reflects(u.usteed, NULL))) {
		    mon = u.usteed;
		    goto buzzmonst;
	    } else if (zap_hit_check((int) u.uac, 0)) {
		range -= 2;
		pline("%s hits you!", The(fltxt));
		/* breaths (except disintegration) are not blocked by reflection */
		if ((!is_breath || abs(type) == ZT_BREATH(ZT_DEATH)) && Reflecting) {
		    if (!Blind) {
		    	ureflects("But %s reflects from your %s!", "it");
		    } else
			pline("For some reason you are not affected.");
		    dx = -dx;
		    dy = -dy;
		    shieldeff(sx, sy);
		} else {
		    zap_hit_u(type, nd, fltxt, sx, sy);
		}
	    } else {
		pline("%s whizzes by you!", The(fltxt));
	    }
	    if (abstype == ZT_LIGHTNING && !resists_blnd(&youmonst)) {
		pline(blinded_by_the_flash);
		make_blinded((long)dice(nd,50),FALSE);
		if (!Blind) pline("Your vision quickly clears.");
	    }
	    stop_occupation();
	    nomul(0, NULL);
	}

	if (loc->typ == TREE && abstype == ZT_DEATH &&
	    abs(type) != ZT_BREATH(ZT_DEATH)) {
	    loc->typ = DEADTREE;
	    if (cansee(sx, sy)) {
		pline("The tree withers!");
		newsym(sx, sy);
	    }
	    range = 0;
	    break;
	}

	if (!ZAP_POS(loc->typ) || (closed_door(level, sx, sy) && (range >= 0))) {
	    int bounce;
	    uchar rmn;

 make_bounce:
	    if (type == ZT_SPELL(ZT_FIRE)) {
		sx = lsx;
		sy = lsy;
		break; /* fireballs explode before the wall */
	    }
	    bounce = 0;
	    range--;
	    if (range && isok(lsx, lsy) && cansee(lsx,lsy))
		pline("%s bounces!", The(fltxt));
	    if (!dx || !dy || !rn2(20)) {
		dx = -dx;
		dy = -dy;
	    } else {
		if (isok(sx,lsy) && ZAP_POS(rmn = level->locations[sx][lsy].typ) &&
		   !closed_door(level, sx,lsy) &&
		   (IS_ROOM(rmn) || (isok(sx+dx,lsy) &&
				     ZAP_POS(level->locations[sx+dx][lsy].typ))))
		    bounce = 1;
		if (isok(lsx,sy) && ZAP_POS(rmn = level->locations[lsx][sy].typ) &&
		   !closed_door(level, lsx,sy) &&
		   (IS_ROOM(rmn) || (isok(lsx,sy+dy) &&
				     ZAP_POS(level->locations[lsx][sy+dy].typ))))
		    if (!bounce || rn2(2))
			bounce = 2;

		switch(bounce) {
		case 0: dx = -dx; /* fall into... */
		case 1: dy = -dy; break;
		case 2: dx = -dx; break;
		}
		tmp_at(DISP_CHANGE, zapdir_to_effect(dx, dy, abstype,
						     show_breath_glyph));
	    }
	}
    }
    tmp_at(DISP_END,0);
    if (type == ZT_SPELL(ZT_FIRE))
	explode(sx, sy, type, dice(12,6), 0, EXPL_FIERY);
    if (shopdamage)
	pay_for_damage(abstype == ZT_FIRE ?  "burn away" :
		       abstype == ZT_COLD ?  "shatter" :
		       abstype == ZT_DEATH ? "disintegrate" : "destroy", FALSE);
    bhitpos = save_bhitpos;
}